

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

bool __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  GLuint GVar4;
  Node *pNVar5;
  Node *n;
  vec2 *pvVar6;
  _func_int *p_Var7;
  Element *first;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vec2 vVar11;
  uint uVar12;
  size_t sVar13;
  ostream *poVar14;
  long lVar15;
  undefined8 *puVar16;
  mat4 *pmVar17;
  Element *__s;
  uint *puVar18;
  mat4 *pmVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  byte bVar24;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  uint auStack_170 [18];
  uint auStack_128 [2];
  undefined8 uStack_120;
  undefined1 auStack_118 [32];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined8 uStack_dc;
  undefined8 local_d4;
  undefined1 auStack_c8 [8];
  char buffer [16];
  mat4 local_78;
  
  bVar24 = 0;
  pNVar5 = (this->super_Renderer).m_sceneRoot;
  if (pNVar5 == (Node *)0x0) {
    uStack_120 = 0x115b4a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"W [",3);
    uStack_120 = 0x115b4f;
    lVar15 = std::chrono::_V2::system_clock::now();
    auVar8 = SEXT816(lVar15 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar9 = SEXT816(lVar15 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar10 = SEXT816(lVar15 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    uStack_120 = 0x115c24;
    snprintf(auStack_c8,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar15 / 1000000000) +
                          ((int)(auVar8._8_8_ >> 0xb) - (auVar8._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar15 / 1000000) +
                          ((int)(auVar9._8_8_ >> 7) - (auVar9._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar15 / 1000) +
                          ((int)(auVar10._8_8_ >> 7) - (auVar10._12_4_ >> 0x1f)) * -1000));
    uStack_120 = 0x115c34;
    local_78.m._0_8_ = (char *)((long)&local_78 + 0x10U);
    sVar13 = strlen(auStack_c8);
    uStack_120 = 0x115c4e;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,auStack_c8,buffer + (sVar13 - 8));
    uStack_120 = 0x115c5d;
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_78.m._0_8_,local_78.m._8_8_);
    uStack_120 = 0x115c74;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]: ",3);
    uStack_120 = 0x115c88;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"virtual bool rengine::OpenGLRenderer::render()",0x2e);
    uStack_120 = 0x115c9c;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
    uStack_120 = 0x115cb0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14," - no \'sceneRoot\', surely this is not what you intended?",0x38);
    uStack_120 = 0x115cc4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    uStack_120 = 0x115ccf;
    std::ostream::put((char)poVar14);
    uStack_120 = 0x115cd7;
    std::ostream::flush();
    if ((char *)local_78.m._0_8_ != (char *)((long)&local_78 + 0x10U)) {
      uStack_120 = 0x115ce5;
      operator_delete((void *)local_78.m._0_8_);
    }
  }
  else {
    uVar1 = (this->super_Renderer).m_fillColor.x;
    uVar3 = (this->super_Renderer).m_fillColor.y;
    uVar2._0_4_ = (this->super_Renderer).m_fillColor.z;
    uVar2._4_4_ = (this->super_Renderer).m_fillColor.w;
    uStack_120 = 0x115867;
    glClearColor(uVar1,uVar3,uVar2,uVar2._4_4_);
    uStack_120 = 0x115871;
    glClear(0x4000);
    this->m_numTransformNodesWith3d = 0;
    this->m_numRenderNodes = 0;
    this->m_additionalQuads = 0;
    this->m_vertexIndex = 0;
    this->m_numLayeredNodes = 0;
    this->m_numTextureNodes = 0;
    this->m_numRectangleNodes = 0;
    this->m_numTransformNodes = 0;
    this->m_elementIndex = 0;
    uStack_120 = 0x115898;
    prepass(this,(this->super_Renderer).m_sceneRoot);
    iVar20 = this->m_numLayeredNodes + this->m_numTextureNodes + this->m_numRectangleNodes;
    uVar12 = this->m_additionalQuads + iVar20;
    if ((uVar12 & 0x3fffffff) != 0) {
      uVar23 = (ulong)(uVar12 * 4);
      this->m_vertices = (vec2 *)(auStack_118 + uVar23 * -8);
      uVar12 = iVar20 + this->m_numTransformNodesWith3d + this->m_numRenderNodes;
      uVar21 = (ulong)uVar12;
      __s = (Element *)((vec2 *)(auStack_118 + uVar23 * -8) + uVar21 * -4);
      this->m_elements = __s;
      *(undefined8 *)&__s[-1].field_0x18 = 0x11590f;
      memset(__s,0,uVar21 * 0x20);
      n = (this->super_Renderer).m_sceneRoot;
      *(undefined8 *)&__s[-1].field_0x18 = 0x11591b;
      build(this,n);
      if (uVar12 == 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x115d19;
        __assert_fail("elementCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d4,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if (this->m_elementIndex != uVar12) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x115d38;
        __assert_fail("m_elementIndex == elementCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3d5,"virtual bool rengine::OpenGLRenderer::render()");
      }
      GVar4 = this->m_texCoordBuffer;
      *(undefined8 *)&__s[-1].field_0x18 = 0x115945;
      glBindBuffer(0x8892,GVar4);
      *(undefined8 *)&__s[-1].field_0x18 = 0x115961;
      glVertexAttribPointer(1,2,0x1406,0,0,0);
      GVar4 = this->m_vertexBuffer;
      *(undefined8 *)&__s[-1].field_0x18 = 0x115971;
      glBindBuffer(0x8892,GVar4);
      *(undefined8 *)&__s[-1].field_0x18 = 0x11597b;
      glDisable(0xb71);
      *(undefined8 *)&__s[-1].field_0x18 = 0x115985;
      glDisable(0xb90);
      *(undefined8 *)&__s[-1].field_0x18 = 0x11598c;
      glDepthMask(0);
      *(undefined8 *)&__s[-1].field_0x18 = 0x115996;
      glEnable(0xbe2);
      *(undefined8 *)&__s[-1].field_0x18 = 0x1159a5;
      glBlendFunc(1,0x303);
      pvVar6 = this->m_vertices;
      *(undefined8 *)&__s[-1].field_0x18 = 0x1159be;
      glBufferData(0x8892,uVar23 << 3,pvVar6,0x88e4);
      p_Var7 = ((this->super_Renderer).m_surface)->m_impl->_vptr_SurfaceBackendImpl[6];
      *(undefined8 *)&__s[-1].field_0x18 = 0x1159cc;
      (*p_Var7)();
      vVar11.y = extraout_XMM0_Db;
      vVar11.x = extraout_XMM0_Da;
      this->m_surfaceSize = vVar11;
      auStack_c8._0_4_ = 1.0;
      auStack_c8._4_4_ = 0.0;
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = -0x80;
      buffer[7] = -0x41;
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = -0x80;
      buffer[0xf] = '?';
      auStack_118._8_4_ = 2.0 / extraout_XMM0_Da;
      auStack_118._12_8_ = 0;
      auStack_118._20_8_ = 0;
      auStack_118._28_4_ = -2.0 / extraout_XMM0_Db;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0x3f800000;
      local_e4 = 0;
      uStack_dc = 0;
      local_d4 = 0x23f800000;
      puVar16 = (undefined8 *)(auStack_118 + 8);
      puVar18 = &__s[-3].texture;
      for (lVar15 = 8; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(undefined8 *)puVar18 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
        puVar18 = (uint *)((long)puVar18 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      __s[-1].texture = 2;
      __s[-3].vboOffset = 0x115a83;
      __s[-3].z = 0.0;
      mat4::operator*(&local_78,(mat4 *)auStack_c8,*(mat4 *)&__s[-3].texture);
      pmVar17 = &local_78;
      pmVar19 = &this->m_proj;
      for (lVar15 = 0x11; lVar15 != 0; lVar15 = lVar15 + -1) {
        pmVar19->m[0] = pmVar17->m[0];
        pmVar17 = (mat4 *)((long)pmVar17 + (ulong)bVar24 * -8 + 4);
        pmVar19 = (mat4 *)((long)pmVar19 + (ulong)bVar24 * -8 + 4);
      }
      if ((this->field_0x1f8 & 2) != 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x115d57;
        __assert_fail("!m_layered",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3ea,"virtual bool rengine::OpenGLRenderer::render()");
      }
      if ((this->field_0x1f8 & 1) != 0) {
        *(undefined8 *)&__s[-1].field_0x18 = 0x115d76;
        __assert_fail("!m_render3d",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3eb,"virtual bool rengine::OpenGLRenderer::render()");
      }
      first = this->m_elements;
      *(undefined8 *)&__s[-1].field_0x18 = 0x115ac3;
      render(this,first,first + uVar21);
      if (this->m_activeShader != (Program *)0x0) {
        iVar20 = (this->m_activeShader->super_OpenGLShaderProgram).m_attributeCount;
        *(undefined8 *)&__s[-1].field_0x18 = 0x115ada;
        glUseProgram(0);
        iVar22 = iVar20;
        if (iVar20 < 0) {
          do {
            *(undefined8 *)&__s[-1].field_0x18 = 0x115aea;
            glEnableVertexAttribArray(iVar22);
            iVar22 = iVar22 + 1;
          } while (iVar22 != 0);
        }
        if (0 < iVar20) {
          do {
            iVar20 = iVar20 + -1;
            *(undefined8 *)&__s[-1].field_0x18 = 0x115aff;
            glDisableVertexAttribArray(iVar20);
          } while (iVar20 != 0);
        }
        this->m_activeShader = (Program *)0x0;
      }
      if (this->m_fbo != 0) {
        *(undefined1 **)&__s[-1].field_0x18 = &LAB_00115d95;
        __assert_fail("m_fbo == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                      ,0x3f0,"virtual bool rengine::OpenGLRenderer::render()");
      }
      this->m_vertices = (vec2 *)0x0;
      this->m_elements = (Element *)0x0;
    }
  }
  return pNVar5 != (Node *)0x0;
}

Assistant:

inline bool OpenGLRenderer::render()
{
    if (sceneRoot() == 0) {
        logw << " - no 'sceneRoot', surely this is not what you intended?" << std::endl;
        return false;
    }

    vec4 c = fillColor();
    glClearColor(c.x, c.y, c.z, c.w);
    glClear(GL_COLOR_BUFFER_BIT);

    logd << std::endl;

    m_numLayeredNodes = 0;
    m_numTextureNodes = 0;
    m_numRectangleNodes = 0;
    m_numTransformNodes = 0;
    m_numTransformNodesWith3d = 0;
    m_numRenderNodes = 0;
    m_additionalQuads = 0;
    m_vertexIndex = 0;
    m_elementIndex = 0;
    prepass(sceneRoot());

    unsigned vertexCount = (m_numTextureNodes
                            + m_numLayeredNodes
                            + m_numRectangleNodes
                            + m_additionalQuads) * 4;
    if (vertexCount == 0)
        return true;

    m_vertices = (vec2 *) alloca(vertexCount * sizeof(vec2));
    unsigned elementCount = (m_numLayeredNodes + m_numTextureNodes + m_numRectangleNodes + m_numTransformNodesWith3d + m_numRenderNodes);
    m_elements = (Element *) alloca(elementCount * sizeof(Element));
    memset(m_elements, 0, elementCount * sizeof(Element));
    // std::cout << "render: " << m_numTextureNodes << " textures, "
    //                    << m_numRectangleNodes << " rects, "
    //                    << m_numTransformNodes << " xforms, "
    //                    << m_numTransformNodesWith3d << " xforms3D, "
    //                    << m_numLayeredNodes << " layered nodes (opacity, colorfilter, blur or shadow), "
    //                    << vertexCount * sizeof(vec2) << " bytes (" << vertexCount << " vertices), "
    //                    << elementCount * sizeof(Element) << " bytes (" << elementCount << " elements)"
    //                    << std::endl;
    build(sceneRoot());
    assert(elementCount > 0);
    assert(m_elementIndex == elementCount);
    // for (unsigned i=0; i<m_elementIndex; ++i) {
    //     const Element &e = m_elements[i];
    //     std::cout << " " << std::setw(5) << i << ": " << "element=" << &e << " node=" << e.node << " " << e.node->type() << " "
    //          << (e.projection ? "projection " : "")
    //          << "vboOffset=" << std::setw(5) << e.vboOffset << " "
    //          << "groupSize=" << std::setw(3) << e.groupSize << " "
    //          << "z=" << e.z << " " << std::endl;
    // }
    // for (unsigned i=0; i<m_vertexIndex; ++i)
    //     std::cout << "vertex[" << std::setw(5) << i << "]=" << m_vertices[i] << std::endl;

    setDefaultOpenGLState();

    // setDefaultOpenGLState will leave m_vertexBuffer bound, so we just upload into it..
    glBufferData(GL_ARRAY_BUFFER, vertexCount * sizeof(vec2), m_vertices, GL_STATIC_DRAW);

    m_surfaceSize = targetSurface()->size();
    m_proj = mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / m_surfaceSize.x, -2.0f / m_surfaceSize.y);

    assert(!m_layered);
    assert(!m_render3d);
    render(m_elements, m_elements + elementCount);

    activateShader(0);

    assert(m_fbo == 0);
    m_vertices = 0;
    m_elements = 0;

    logd << std::endl;

    return true;
}